

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_call(Parser *parser)

{
  Kind KVar1;
  Token *name;
  List *list;
  void *data;
  ConstantTerm *expr;
  CallTerm *pCVar2;
  
  name = parser->token;
  list = new_list();
  move(parser);
  expect(parser,OP_BRA);
  KVar1 = parser->token->kind;
  while (KVar1 != CL_BRA) {
    data = parse_logic(parser);
    list_add(list,data);
    if (parser->token->kind == CL_BRA) break;
    move(parser);
    KVar1 = parser->token->kind;
    if (KVar1 == COMM) {
      move(parser);
      KVar1 = parser->token->kind;
    }
  }
  expect(parser,CL_BRA);
  expr = new_constant_term(name);
  pCVar2 = new_call_term(expr,list);
  return pCVar2;
}

Assistant:

void *parse_call(Parser *parser) {
    Token *token = token(parser);
    List *args = new_list();
    move(parser);
    expect(parser, OP_BRA);
    while (token(parser)->kind != CL_BRA) {
        list_add(args, parse_expr(parser));
        if (token(parser)->kind == CL_BRA)break;
        move(parser);
        if (token(parser)->kind == COMM)
            move(parser);
    }
    expect(parser, CL_BRA);
    return new_call_term(new_constant_term(token), args);
}